

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *this_00;
  EnumGenerator *this_01;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_02;
  MessageGenerator *this_03;
  FieldDescriptor *field_00;
  FieldGenerator *pFVar5;
  Descriptor *this_04;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *this_05;
  ExtensionGenerator *this_06;
  FileDescriptor *pFVar6;
  string *value2;
  undefined1 qualified;
  FieldDescriptor *field_01;
  int local_80;
  int i_4;
  string local_70;
  string local_50;
  FieldDescriptor *local_30;
  FieldDescriptor *field;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  _i_1 = printer;
  printer_local = (Printer *)this;
  for (i_2 = 0; iVar4 = i_2, iVar3 = Descriptor::enum_type_count(this->descriptor_), iVar4 < iVar3;
      i_2 = i_2 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
              ::operator[](&this->enum_generators_,(long)i_2);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->
                        (this_00);
    EnumGenerator::GenerateMethods(this_01,_i_1);
  }
  for (i_3 = 0; iVar4 = i_3, iVar3 = Descriptor::nested_type_count(this->descriptor_), iVar4 < iVar3
      ; i_3 = i_3 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
              ::operator[](&this->nested_generators_,(long)i_3);
    this_03 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                        (this_02);
    GenerateClassMethods(this_03,_i_1);
    io::Printer::Print(_i_1,"\n");
    io::Printer::Print(_i_1,
                       "// -------------------------------------------------------------------\n");
    io::Printer::Print(_i_1,"\n");
  }
  for (field._4_4_ = 0; iVar4 = field._4_4_, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar4 < iVar3; field._4_4_ = field._4_4_ + 1) {
    field_00 = Descriptor::field(this->descriptor_,field._4_4_);
    pFVar5 = FieldGeneratorMap::get(&this->field_generators_,field_00);
    (*pFVar5->_vptr_FieldGenerator[5])(pFVar5,_i_1);
  }
  io::Printer::Print(_i_1,"#ifndef _MSC_VER\n");
  field._0_4_ = 0;
  while( true ) {
    iVar4 = (int)field;
    iVar3 = Descriptor::field_count(this->descriptor_);
    qualified = (undefined1)iVar3;
    if (iVar3 <= iVar4) break;
    local_30 = Descriptor::field(this->descriptor_,(int)field);
    pPVar1 = _i_1;
    this_04 = FieldScope(local_30);
    ClassName_abi_cxx11_(&local_50,(cxx *)this_04,(Descriptor *)0x0,(bool)qualified);
    FieldConstantName_abi_cxx11_(&local_70,(cxx *)local_30,field_01);
    io::Printer::Print(pPVar1,"const int $classname$::$constant_name$;\n","classname",&local_50,
                       "constant_name",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    field._0_4_ = (int)field + 1;
  }
  io::Printer::Print(_i_1,"#endif  // !_MSC_VER\n\n");
  for (local_80 = 0; iVar4 = Descriptor::extension_count(this->descriptor_), local_80 < iVar4;
      local_80 = local_80 + 1) {
    this_05 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,(long)local_80);
    this_06 = internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->
                        (this_05);
    ExtensionGenerator::GenerateDefinition(this_06,_i_1);
  }
  GenerateStructors(this,_i_1);
  io::Printer::Print(_i_1,"\n");
  pFVar6 = Descriptor::file(this->descriptor_);
  bVar2 = HasGeneratedMethods(pFVar6);
  if (bVar2) {
    GenerateClear(this,_i_1);
    io::Printer::Print(_i_1,"\n");
    GenerateMergeFromCodedStream(this,_i_1);
    io::Printer::Print(_i_1,"\n");
    GenerateSerializeWithCachedSizes(this,_i_1);
    io::Printer::Print(_i_1,"\n");
    pFVar6 = Descriptor::file(this->descriptor_);
    bVar2 = HasFastArraySerialization(pFVar6);
    if (bVar2) {
      GenerateSerializeWithCachedSizesToArray(this,_i_1);
      io::Printer::Print(_i_1,"\n");
    }
    GenerateByteSize(this,_i_1);
    io::Printer::Print(_i_1,"\n");
    GenerateMergeFrom(this,_i_1);
    io::Printer::Print(_i_1,"\n");
    GenerateCopyFrom(this,_i_1);
    io::Printer::Print(_i_1,"\n");
    GenerateIsInitialized(this,_i_1);
    io::Printer::Print(_i_1,"\n");
    GenerateParseFromXmlString(this,_i_1);
    io::Printer::Print(_i_1,"\n");
    GenerateParsePartialFromXmlString(this,_i_1);
    io::Printer::Print(_i_1,"\n");
    GenerateSerializeToXmlString(this,_i_1);
    io::Printer::Print(_i_1,"\n");
    GenerateSerializePartialToXmlString(this,_i_1);
    io::Printer::Print(_i_1,"\n");
  }
  GenerateSwap(this,_i_1);
  io::Printer::Print(_i_1,"\n");
  pFVar6 = Descriptor::file(this->descriptor_);
  bVar2 = HasDescriptorMethods(pFVar6);
  pPVar1 = _i_1;
  if (bVar2) {
    io::Printer::Print(_i_1,
                       "::google::protobuf::Metadata $classname$::GetMetadata() const {\n  protobuf_AssignDescriptorsOnce();\n  ::google::protobuf::Metadata metadata;\n  metadata.descriptor = $classname$_descriptor_;\n  metadata.reflection = $classname$_reflection_;\n  return metadata;\n}\n\n"
                       ,"classname",&this->classname_);
  }
  else {
    value2 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,
                       "::std::string $classname$::GetTypeName() const {\n  return \"$type_name$\";\n}\n\n"
                       ,"classname",&this->classname_,"type_name",value2);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateClassMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateMethods(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateClassMethods(printer);
    printer->Print("\n");
    printer->Print(kThinSeparator);
    printer->Print("\n");
  }

  // Generate non-inline field definitions.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateNonInlineAccessorDefinitions(printer);
  }

  // Generate field number constants.
  printer->Print("#ifndef _MSC_VER\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor *field = descriptor_->field(i);
    printer->Print(
      "const int $classname$::$constant_name$;\n",
      "classname", ClassName(FieldScope(field), false),
      "constant_name", FieldConstantName(field));
  }
  printer->Print(
    "#endif  // !_MSC_VER\n"
    "\n");

  // Define extension identifiers.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_[i]->GenerateDefinition(printer);
  }

  GenerateStructors(printer);
  printer->Print("\n");

  if (HasGeneratedMethods(descriptor_->file())) {
    GenerateClear(printer);
    printer->Print("\n");

    GenerateMergeFromCodedStream(printer);
    printer->Print("\n");

    GenerateSerializeWithCachedSizes(printer);
    printer->Print("\n");

    if (HasFastArraySerialization(descriptor_->file())) {
      GenerateSerializeWithCachedSizesToArray(printer);
      printer->Print("\n");
    }

    GenerateByteSize(printer);
    printer->Print("\n");

    GenerateMergeFrom(printer);
    printer->Print("\n");

    GenerateCopyFrom(printer);
    printer->Print("\n");

    GenerateIsInitialized(printer);
    printer->Print("\n");

    // Generate xml support -- by chaishushan{AT}gmail.com
    GenerateParseFromXmlString(printer);
    printer->Print("\n");
    GenerateParsePartialFromXmlString(printer);
    printer->Print("\n");
    GenerateSerializeToXmlString(printer);
    printer->Print("\n");
    GenerateSerializePartialToXmlString(printer);
    printer->Print("\n");
  }

  GenerateSwap(printer);
  printer->Print("\n");

  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "::google::protobuf::Metadata $classname$::GetMetadata() const {\n"
      "  protobuf_AssignDescriptorsOnce();\n"
      "  ::google::protobuf::Metadata metadata;\n"
      "  metadata.descriptor = $classname$_descriptor_;\n"
      "  metadata.reflection = $classname$_reflection_;\n"
      "  return metadata;\n"
      "}\n"
      "\n",
      "classname", classname_);
  } else {
    printer->Print(
      "::std::string $classname$::GetTypeName() const {\n"
      "  return \"$type_name$\";\n"
      "}\n"
      "\n",
      "classname", classname_,
      "type_name", descriptor_->full_name());
  }

}